

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

int setbf(match *res,bitfield *bf,ull num)

{
  int iVar1;
  expr *expr;
  expr local_68;
  
  if (bf->pcrel != 0) {
    expr = makeex(EXPR_NUM);
    expr->num1 = num;
    expr->isimm = 1;
    iVar1 = setbfe(res,bf,expr);
    return iVar1;
  }
  local_68.num2 = 0;
  local_68.vexprs = (expr **)0x0;
  local_68.vexprsnum = 0;
  local_68.vexprsmax = 0;
  local_68.expr1 = (expr *)0x0;
  local_68.expr2 = (expr *)0x0;
  local_68.type = EXPR_NUM;
  local_68._4_4_ = 0;
  local_68.str = (char *)0x0;
  local_68.isimm = 1;
  local_68.special = 0;
  local_68.num1 = num;
  iVar1 = setbfe(res,bf,&local_68);
  return iVar1;
}

Assistant:

int setbf (struct match *res, const struct bitfield *bf, ull num) {
	if (bf->pcrel) {
		struct expr *e = makeex(EXPR_NUM);
		e->num1 = num;
		e->isimm = 1;
		return setbfe(res, bf, e);
	} else {
		struct expr e = { .type = EXPR_NUM, .num1 = num, .isimm = 1 };
		return setbfe(res, bf, &e);
	}
}